

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O1

void * cloneOption(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 *puVar3;
  char *pcVar4;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (void *)0x0;
    }
    pcVar4 = "invalid argument (name=%p, value=%p)";
    iVar1 = 0x128;
  }
  else {
    iVar1 = strcmp("SAVED_OPTION_MAX_ENQUEUE_TIME_SECS",name);
    if (((iVar1 == 0) || (iVar1 = strcmp("SAVED_OPTION_MAX_PROCESSING_TIME_SECS",name), iVar1 == 0))
       || (iVar1 = strcmp("SAVED_OPTION_MAX_RETRY_COUNT",name), iVar1 == 0)) {
      puVar3 = (undefined8 *)malloc(8);
      if (puVar3 != (undefined8 *)0x0) {
        *puVar3 = *value;
        return puVar3;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return (void *)0x0;
      }
      pcVar4 = "failed cloning option %s (malloc failed)";
      iVar1 = 0x131;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return (void *)0x0;
      }
      pcVar4 = "option %s is invalid";
      iVar1 = 0x13a;
    }
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
            ,"cloneOption",iVar1,1,pcVar4,name);
  return (void *)0x0;
}

Assistant:

static void* cloneOption(const char* name, const void* value)
{
    void* result;

    if (name == NULL || value == NULL)
    {
        LogError("invalid argument (name=%p, value=%p)", name, value);
        result = NULL;
    }
    else if (strcmp(SAVED_OPTION_MAX_ENQUEUE_TIME_SECS, name) == 0 ||
        strcmp(SAVED_OPTION_MAX_PROCESSING_TIME_SECS, name) == 0 ||
        strcmp(SAVED_OPTION_MAX_RETRY_COUNT, name) == 0)
    {
        if ((result = malloc(sizeof(size_t))) == NULL)
        {
            LogError("failed cloning option %s (malloc failed)", name);
        }
        else
        {
            memcpy(result, value, sizeof(size_t));
        }
    }
    else
    {
        LogError("option %s is invalid", name);
        result = NULL;
    }

    return result;
}